

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<double>(double value,int precision)

{
  uint uVar1;
  ReusableStringStream *this;
  long lVar2;
  long lVar3;
  int in_ESI;
  string *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  size_t i;
  ReusableStringStream rss;
  string *d;
  ReusableStringStream *in_stack_ffffffffffffff38;
  ReusableStringStream *in_stack_ffffffffffffff40;
  _Setprecision *in_stack_ffffffffffffff48;
  ReusableStringStream *in_stack_ffffffffffffff50;
  ReusableStringStream *in_stack_ffffffffffffff70;
  allocator *paVar4;
  allocator local_3d;
  int local_3c;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = in_ESI;
  uVar1 = isnan(in_XMM0_Qa);
  if ((uVar1 & 1) == 0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff70);
    clara::std::setprecision(local_3c);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    this = ReusableStringStream::operator<<
                     (in_stack_ffffffffffffff40,
                      (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff38);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff38);
    lVar2 = std::__cxx11::string::find_last_not_of((char)in_RDI,0x30);
    if ((lVar2 != -1) && (lVar3 = std::__cxx11::string::size(), lVar2 != lVar3 + -1)) {
      std::__cxx11::string::operator[]((ulong)in_RDI);
      std::__cxx11::string::substr((ulong)local_28,(ulong)in_RDI);
      std::__cxx11::string::operator=((string *)in_RDI,local_28);
      std::__cxx11::string::~string(local_28);
    }
    ReusableStringStream::~ReusableStringStream(this);
  }
  else {
    paVar4 = &local_3d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"nan",paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}